

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseOrExpr(Parser *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  Parser *in_RSI;
  _Alloc_hider local_48;
  undefined1 local_3c [4];
  _Alloc_hider local_38;
  
  parseAndExpr(this);
  while ((in_RSI->m_currToken).type == Or) {
    eatToken(in_RSI,Or);
    parseAndExpr((Parser *)&stack0xffffffffffffffc8);
    local_3c = (undefined1  [4])0x6;
    std::
    make_unique<AST::BinaryExpr,TokenType,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_48,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)local_3c,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    _Var2._M_p = local_48._M_p;
    local_48._M_p = (pointer)0x0;
    plVar1 = (long *)(this->m_lexer).m_input._M_dataplus._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = _Var2._M_p;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      if ((long *)local_48._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_48._M_p + 8))();
      }
    }
    if ((long *)local_38._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_p + 8))();
    }
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseOrExpr() {
    std::unique_ptr<AST::Expr> expr = parseAndExpr();
    while (m_currToken.type == TokenType::Or) {
        eatToken(m_currToken.type);
        auto right = parseAndExpr();
        expr = std::make_unique<AST::BinaryExpr>(TokenType::Or,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}